

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O1

node * __thiscall cds::intrusive::FreeList::get(FreeList *this)

{
  __int_type_conflict1 _Var1;
  uint uVar2;
  node *pnVar3;
  node *pnVar4;
  __pointer_type pnVar5;
  __pointer_type pnVar6;
  node *in_RCX;
  bool bVar7;
  bool bVar8;
  
  pnVar3 = (this->m_Head)._M_b._M_p;
  do {
    if (pnVar3 == (node *)0x0) {
      return (node *)0x0;
    }
    uVar2 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
    if ((uVar2 & 0x7fffffff) == 0) {
LAB_00106db3:
      pnVar4 = (this->m_Head)._M_b._M_p;
      bVar7 = false;
    }
    else {
      LOCK();
      bVar7 = uVar2 == (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
      if (bVar7) {
        (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar2 + 1;
      }
      UNLOCK();
      if (!bVar7) goto LAB_00106db3;
      LOCK();
      pnVar4 = (this->m_Head)._M_b._M_p;
      bVar7 = pnVar3 == pnVar4;
      if (bVar7) {
        (this->m_Head)._M_b._M_p = (pnVar3->m_freeListNext)._M_b._M_p;
        pnVar4 = pnVar3;
      }
      UNLOCK();
      if (bVar7) {
        if ((int)(pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i < 0) {
          __assert_fail("(head->m_freeListRefs.load( atomics::memory_order_relaxed ) & c_ShouldBeOnFreeList) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/STEllAR-GROUP[P]libcds/cds/intrusive/free_list.h"
                        ,0x84,"node *cds::intrusive::FreeList::get()");
        }
        LOCK();
        (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i =
             (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
        UNLOCK();
        bVar7 = true;
        in_RCX = pnVar3;
        pnVar4 = pnVar3;
      }
      else {
        LOCK();
        _Var1 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
        (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i =
             (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
        bVar7 = false;
        if (_Var1 == 0x80000001) {
          pnVar5 = (this->m_Head)._M_b._M_p;
          do {
            (pnVar3->m_freeListNext)._M_b._M_p = pnVar5;
            (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            LOCK();
            pnVar6 = (this->m_Head)._M_b._M_p;
            bVar8 = pnVar5 == pnVar6;
            if (bVar8) {
              (this->m_Head)._M_b._M_p = pnVar3;
              pnVar6 = pnVar5;
            }
            UNLOCK();
            if (bVar8) break;
            LOCK();
            _Var1 = (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i;
            (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i =
                 (pnVar3->m_freeListRefs).super___atomic_base<unsigned_int>._M_i + 0x7fffffff;
            UNLOCK();
            pnVar5 = pnVar6;
          } while (_Var1 == 1);
        }
      }
    }
    pnVar3 = pnVar4;
    if (bVar7) {
      return in_RCX;
    }
  } while( true );
}

Assistant:

node * get()
        {
            auto head = m_Head.load( atomics::memory_order_acquire );
            while ( head != nullptr ) {
                auto prevHead = head;
                auto refs = head->m_freeListRefs.load( atomics::memory_order_relaxed );

                if ( cds_unlikely( (refs & c_RefsMask) == 0 || !head->m_freeListRefs.compare_exchange_strong( refs, refs + 1,
                    atomics::memory_order_acquire, atomics::memory_order_relaxed )))
                {
                    head = m_Head.load( atomics::memory_order_acquire );
                    continue;
                }

                // Good, reference count has been incremented (it wasn't at zero), which means
                // we can read the next and not worry about it changing between now and the time
                // we do the CAS
                node * next = head->m_freeListNext.load( atomics::memory_order_relaxed );
                if ( cds_likely( m_Head.compare_exchange_strong( head, next, atomics::memory_order_acquire, atomics::memory_order_relaxed ))) {
                    // Yay, got the node. This means it was on the list, which means
                    // shouldBeOnFreeList must be false no matter the refcount (because
                    // nobody else knows it's been taken off yet, it can't have been put back on).
                    assert( (head->m_freeListRefs.load( atomics::memory_order_relaxed ) & c_ShouldBeOnFreeList) == 0 );

                    // Decrease refcount twice, once for our ref, and once for the list's ref
                    head->m_freeListRefs.fetch_sub( 2, atomics::memory_order_relaxed );

                    return head;
                }

                // OK, the head must have changed on us, but we still need to decrease the refcount we
                // increased
                refs = prevHead->m_freeListRefs.fetch_sub( 1, atomics::memory_order_acq_rel );
                if ( refs == c_ShouldBeOnFreeList + 1 )
                    add_knowing_refcount_is_zero( prevHead );
            }

            return nullptr;
        }